

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFns.c
# Opt level: O2

newtRef NsSetContains(newtRefArg rcvr,newtRefArg array,newtRefArg item)

{
  long v;
  long lVar1;
  _Bool _Var2;
  uint32_t uVar3;
  void *pvVar4;
  newtRef nVar5;
  long lVar6;
  
  _Var2 = NewtRefIsArray(array);
  if (!_Var2) {
    nVar5 = NewtThrow(-0xbd11,array);
    return nVar5;
  }
  pvVar4 = NewtRefToData(array);
  uVar3 = NewtLength(array);
  lVar6 = -1;
  do {
    if (lVar6 - (ulong)uVar3 == -1) {
      return 2;
    }
    v = lVar6 + 1;
    lVar1 = lVar6 * 8;
    lVar6 = v;
  } while (*(newtRefArg *)((long)pvVar4 + lVar1 + 8) != item);
  nVar5 = NewtMakeInteger(v);
  return nVar5;
}

Assistant:

newtRef NsSetContains(newtRefArg rcvr, newtRefArg array, newtRefArg item) {
    if (!NewtRefIsArray(array)) {
        return NewtThrow(kNErrNotAnArray, array);
    }
    
    newtRef *	slots;
    uint32_t	n;
    uint32_t	i;
    
    slots = NewtRefToSlots(array);
    n = NewtLength(array);
    
    for (i = 0; i < n; i++)
    {
        if (slots[i] == item) {
            return NewtMakeInteger(i);
        }
    }
    
    return kNewtRefNIL;
}